

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__
                  ,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  bool bVar1;
  size_type __n;
  reference pTVar2;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_50;
  const_iterator itEnd;
  const_iterator it;
  IConfig *config_local;
  TestSpec *testSpec_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *filtered;
  
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector(__return_storage_ptr__);
  __n = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(testCases);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (__return_storage_ptr__,__n);
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(testCases);
  local_50._M_current =
       (TestCase *)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(testCases);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_50), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar1 = matchTest(pTVar2,testSpec,config);
    if (bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (__return_storage_ptr__,pTVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCase> filterTests(std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config) {
		std::vector<TestCase> filtered;
		filtered.reserve(testCases.size());
		for (std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
			it != itEnd;
			++it)
			if (matchTest(*it, testSpec, config))
				filtered.push_back(*it);
		return filtered;
	}